

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O2

bool __thiscall ftxui::SliderBase<long>::OnEvent(SliderBase<long> *this,Event *event)

{
  string *__lhs;
  Event *pEVar1;
  bool bVar2;
  __type _Var3;
  long *plVar4;
  long lVar5;
  Event EStack_e8;
  Event local_a8;
  Event local_68;
  
  if (event->type_ == Mouse) {
    Event::Event(&local_68,event);
    bVar2 = OnMouseEvent(this,&local_68);
    pEVar1 = &local_68;
LAB_0013bd1e:
    std::__cxx11::string::~string((string *)&pEVar1->input_);
    return bVar2;
  }
  __lhs = &event->input_;
  _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(Event::ArrowLeft + 0x18));
  if (!_Var3) {
    Event::Character(&EStack_e8,'h');
    _Var3 = std::operator==(__lhs,&EStack_e8.input_);
    std::__cxx11::string::~string((string *)&EStack_e8.input_);
    if (!_Var3) {
      _Var3 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(Event::ArrowRight + 0x18));
      if (!_Var3) {
        Event::Character(&EStack_e8,'l');
        _Var3 = std::operator==(__lhs,&EStack_e8.input_);
        std::__cxx11::string::~string((string *)&EStack_e8.input_);
        if (!_Var3) {
          Event::Event(&local_a8,event);
          bVar2 = ComponentBase::OnEvent(&this->super_ComponentBase,&local_a8);
          pEVar1 = &local_a8;
          goto LAB_0013bd1e;
        }
      }
      plVar4 = this->value_;
      lVar5 = *plVar4 + this->increment_;
      *plVar4 = lVar5;
      if (this->max_ < lVar5) {
        lVar5 = this->max_;
      }
      goto LAB_0013bd83;
    }
  }
  plVar4 = this->value_;
  lVar5 = *plVar4 - this->increment_;
  *plVar4 = lVar5;
  if (lVar5 <= this->min_) {
    lVar5 = this->min_;
  }
LAB_0013bd83:
  *plVar4 = lVar5;
  return true;
}

Assistant:

bool OnEvent(Event event) final {
    if (event.is_mouse())
      return OnMouseEvent(event);

    if (event == Event::ArrowLeft || event == Event::Character('h')) {
      *value_ -= increment_;
      *value_ = std::max(*value_, min_);
      return true;
    }

    if (event == Event::ArrowRight || event == Event::Character('l')) {
      *value_ += increment_;
      *value_ = std::min(*value_, max_);
      return true;
    }

    return ComponentBase::OnEvent(event);
  }